

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O2

int __thiscall
crnlib::adaptive_arith_data_model::init(adaptive_arith_data_model *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  uint32 in_EDX;
  
  if (in_EDX != 1) {
    if (in_EDX == 0) {
      clear(this);
      return extraout_EAX;
    }
    if ((in_EDX & in_EDX - 1) == 0) goto LAB_00177dc6;
  }
  in_EDX = math::next_pow2(in_EDX);
LAB_00177dc6:
  this->m_total_syms = in_EDX;
  vector<crnlib::adaptive_bit_model>::resize(&this->m_probs,in_EDX,false);
  return extraout_EAX_00;
}

Assistant:

void adaptive_arith_data_model::init(bool, uint total_syms) {
  if (!total_syms) {
    clear();
    return;
  }

  if ((total_syms < 2) || (!math::is_power_of_2(total_syms)))
    total_syms = math::next_pow2(total_syms);

  m_total_syms = total_syms;

  m_probs.resize(m_total_syms);
}